

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O2

Fl_Help_Block * __thiscall
Fl_Help_View::add_block(Fl_Help_View *this,char *s,int xx,int yy,int ww,int hh,uchar border)

{
  Fl_Help_Block *pFVar1;
  int iVar2;
  Fl_Help_Block *pFVar3;
  int iVar4;
  
  iVar4 = this->nblocks_;
  iVar2 = this->ablocks_;
  if (iVar4 < iVar2) {
    pFVar3 = this->blocks_;
  }
  else {
    this->ablocks_ = (int)((long)iVar2 + 0x10);
    if (iVar2 == 0) {
      pFVar3 = (Fl_Help_Block *)malloc(0xa80);
      this->blocks_ = pFVar3;
    }
    else {
      pFVar3 = (Fl_Help_Block *)realloc(this->blocks_,((long)iVar2 + 0x10) * 0xa8);
      this->blocks_ = pFVar3;
      iVar4 = this->nblocks_;
    }
  }
  pFVar1 = pFVar3 + iVar4;
  memset(&pFVar1->border,0,0x98);
  pFVar1->start = s;
  pFVar1->end = s;
  pFVar1->x = xx;
  pFVar1->y = yy;
  pFVar1->w = ww;
  pFVar1->h = hh;
  pFVar1->border = border;
  pFVar1->bgcolor = this->bgcolor_;
  this->nblocks_ = this->nblocks_ + 1;
  return pFVar3 + iVar4;
}

Assistant:

Fl_Help_Block *					// O - Pointer to new block
Fl_Help_View::add_block(const char   *s,	// I - Pointer to start of block text
                	int           xx,	// I - X position of block
			int           yy,	// I - Y position of block
			int           ww,	// I - Right margin of block
			int           hh,	// I - Height of block
			unsigned char border)	// I - Draw border?
{
  Fl_Help_Block	*temp;				// New block


  // printf("add_block(s = %p, xx = %d, yy = %d, ww = %d, hh = %d, border = %d)\n",
  //        s, xx, yy, ww, hh, border);

  if (nblocks_ >= ablocks_)
  {
    ablocks_ += 16;

    if (ablocks_ == 16)
      blocks_ = (Fl_Help_Block *)malloc(sizeof(Fl_Help_Block) * ablocks_);
    else
      blocks_ = (Fl_Help_Block *)realloc(blocks_, sizeof(Fl_Help_Block) * ablocks_);
  }

  temp = blocks_ + nblocks_;
  memset(temp, 0, sizeof(Fl_Help_Block));
  temp->start   = s;
  temp->end     = s;
  temp->x       = xx;
  temp->y       = yy;
  temp->w       = ww;
  temp->h       = hh;
  temp->border  = border;
  temp->bgcolor = bgcolor_;
  nblocks_ ++;

  return (temp);
}